

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_arm.c
# Opt level: O0

void print_insn_detail(cs_insn *ins)

{
  uint8_t *puVar1;
  uint uVar2;
  cs_detail *pcVar3;
  char *pcVar4;
  cs_arm_op *op;
  int i;
  cs_arm *arm;
  cs_insn *ins_local;
  
  if (ins->detail != (cs_detail *)0x0) {
    pcVar3 = ins->detail;
    if ((pcVar3->field_6).arm.op_count != '\0') {
      printf("\top_count: %u\n",(ulong)(pcVar3->field_6).arm.op_count);
    }
    for (op._4_4_ = 0; (int)op._4_4_ < (int)(uint)(pcVar3->field_6).arm.op_count;
        op._4_4_ = op._4_4_ + 1) {
      puVar1 = pcVar3->groups + (long)(int)op._4_4_ * 0x28 + 0x36;
      switch(*(uint *)(puVar1 + 0xc)) {
      case 1:
        pcVar4 = cs_reg_name(handle,*(uint *)(puVar1 + 0x10));
        printf("\t\toperands[%u].type: REG = %s\n",(ulong)op._4_4_,pcVar4);
        break;
      case 2:
        printf("\t\toperands[%u].type: IMM = 0x%x\n",(ulong)op._4_4_,(ulong)*(uint *)(puVar1 + 0x10)
              );
        break;
      case 3:
        printf("\t\toperands[%u].type: MEM\n",(ulong)op._4_4_);
        if (*(uint *)(puVar1 + 0x10) != 0) {
          pcVar4 = cs_reg_name(handle,*(uint *)(puVar1 + 0x10));
          printf("\t\t\toperands[%u].mem.base: REG = %s\n",(ulong)op._4_4_,pcVar4);
        }
        if (*(uint *)(puVar1 + 0x14) != 0) {
          pcVar4 = cs_reg_name(handle,*(uint *)(puVar1 + 0x14));
          printf("\t\t\toperands[%u].mem.index: REG = %s\n",(ulong)op._4_4_,pcVar4);
        }
        if (*(uint *)(puVar1 + 0x18) != 1) {
          printf("\t\t\toperands[%u].mem.scale: %u\n",(ulong)op._4_4_,
                 (ulong)*(uint *)(puVar1 + 0x18));
        }
        if (*(uint *)(puVar1 + 0x1c) != 0) {
          printf("\t\t\toperands[%u].mem.disp: 0x%x\n",(ulong)op._4_4_,
                 (ulong)*(uint *)(puVar1 + 0x1c));
        }
        break;
      case 4:
        printf("\t\toperands[%u].type: FP = %f\n",*(undefined8 *)(puVar1 + 0x10),(ulong)op._4_4_);
        break;
      default:
        break;
      case 0x40:
        printf("\t\toperands[%u].type: C-IMM = %u\n",(ulong)op._4_4_,(ulong)*(uint *)(puVar1 + 0x10)
              );
        break;
      case 0x41:
        printf("\t\toperands[%u].type: P-IMM = %u\n",(ulong)op._4_4_,(ulong)*(uint *)(puVar1 + 0x10)
              );
        break;
      case 0x42:
        pcVar4 = "le";
        if (*(uint *)(puVar1 + 0x10) == 1) {
          pcVar4 = "be";
        }
        printf("\t\toperands[%u].type: SETEND = %s\n",(ulong)op._4_4_,pcVar4);
        break;
      case 0x43:
        printf("\t\toperands[%u].type: SYSREG = %u\n",(ulong)op._4_4_,
               (ulong)*(uint *)(puVar1 + 0x10));
      }
      if ((*(uint *)(puVar1 + 4) != 0) && (*(uint *)(puVar1 + 8) != 0)) {
        if (*(uint *)(puVar1 + 4) < 6) {
          printf("\t\t\tShift: %u = %u\n",(ulong)*(uint *)(puVar1 + 4),(ulong)*(uint *)(puVar1 + 8))
          ;
        }
        else {
          uVar2 = *(uint *)(puVar1 + 4);
          pcVar4 = cs_reg_name(handle,*(uint *)(puVar1 + 8));
          printf("\t\t\tShift: %u = %s\n",(ulong)uVar2,pcVar4);
        }
      }
      if (*(uint *)puVar1 != 0xffffffff) {
        printf("\t\toperands[%u].vector_index = %u\n",(ulong)op._4_4_,(ulong)*(uint *)puVar1);
      }
      if ((*(uint *)(puVar1 + 0x20) & 1) != 0) {
        printf("\t\tSubtracted: True\n");
      }
    }
    if (((pcVar3->field_6).arm64.operands[0].shift.type != 0xf) &&
       ((pcVar3->field_6).arm64.operands[0].shift.type != ARM64_SFT_INVALID)) {
      printf("\tCode condition: %u\n",(ulong)(pcVar3->field_6).arm.cc);
    }
    if (((pcVar3->field_6).arm.update_flags & 1U) != 0) {
      printf("\tUpdate-flags: True\n");
    }
    if (((pcVar3->field_6).arm.writeback & 1U) != 0) {
      printf("\tWrite-back: True\n");
    }
    if ((pcVar3->field_6).x86.disp != 0) {
      printf("\tCPSI-mode: %u\n",(ulong)(pcVar3->field_6).arm.cps_mode);
    }
    if ((pcVar3->field_6).x86.sib_index != X86_REG_INVALID) {
      printf("\tCPSI-flag: %u\n",(ulong)(pcVar3->field_6).x86.sib_index);
    }
    if ((pcVar3->field_6).arm64.operands[0].vector_index != 0) {
      printf("\tVector-data: %u\n",(ulong)(pcVar3->field_6).arm.vector_data);
    }
    if ((pcVar3->field_6).arm.vector_size != 0) {
      printf("\tVector-size: %u\n",(ulong)(pcVar3->field_6).ppc.bh);
    }
    if (((pcVar3->field_6).x86.prefix[0] & 1) != 0) {
      printf("\tUser-mode: True\n");
    }
    if ((pcVar3->field_6).x86.sse_cc != X86_SSE_CC_INVALID) {
      printf("\tMemory-barrier: %u\n",(ulong)(pcVar3->field_6).x86.sse_cc);
    }
    printf("\n");
  }
  return;
}

Assistant:

static void print_insn_detail(cs_insn *ins)
{
	cs_arm *arm;
	int i;

	// detail can be NULL on "data" instruction if SKIPDATA option is turned ON
	if (ins->detail == NULL)
		return;

	arm = &(ins->detail->arm);

	if (arm->op_count)
		printf("\top_count: %u\n", arm->op_count);

	for (i = 0; i < arm->op_count; i++) {
		cs_arm_op *op = &(arm->operands[i]);
		switch((int)op->type) {
			default:
				break;
			case ARM_OP_REG:
				printf("\t\toperands[%u].type: REG = %s\n", i, cs_reg_name(handle, op->reg));
				break;
			case ARM_OP_IMM:
				printf("\t\toperands[%u].type: IMM = 0x%x\n", i, op->imm);
				break;
			case ARM_OP_FP:
				printf("\t\toperands[%u].type: FP = %f\n", i, op->fp);
				break;
			case ARM_OP_MEM:
				printf("\t\toperands[%u].type: MEM\n", i);
				if (op->mem.base != X86_REG_INVALID)
					printf("\t\t\toperands[%u].mem.base: REG = %s\n",
							i, cs_reg_name(handle, op->mem.base));
				if (op->mem.index != X86_REG_INVALID)
					printf("\t\t\toperands[%u].mem.index: REG = %s\n",
							i, cs_reg_name(handle, op->mem.index));
				if (op->mem.scale != 1)
					printf("\t\t\toperands[%u].mem.scale: %u\n", i, op->mem.scale);
				if (op->mem.disp != 0)
					printf("\t\t\toperands[%u].mem.disp: 0x%x\n", i, op->mem.disp);

				break;
			case ARM_OP_PIMM:
				printf("\t\toperands[%u].type: P-IMM = %u\n", i, op->imm);
				break;
			case ARM_OP_CIMM:
				printf("\t\toperands[%u].type: C-IMM = %u\n", i, op->imm);
				break;
			case ARM_OP_SETEND:
				printf("\t\toperands[%u].type: SETEND = %s\n", i, op->setend == ARM_SETEND_BE? "be" : "le");
				break;
			case ARM_OP_SYSREG:
				printf("\t\toperands[%u].type: SYSREG = %u\n", i, op->reg);
				break;
		}

		if (op->shift.type != ARM_SFT_INVALID && op->shift.value) {
			if (op->shift.type < ARM_SFT_ASR_REG)
				// shift with constant value
				printf("\t\t\tShift: %u = %u\n", op->shift.type, op->shift.value);
			else
				// shift with register
				printf("\t\t\tShift: %u = %s\n", op->shift.type,
						cs_reg_name(handle, op->shift.value));
		}

		if (op->vector_index != -1) {
			printf("\t\toperands[%u].vector_index = %u\n", i, op->vector_index);
		}

		if (op->subtracted)
			printf("\t\tSubtracted: True\n");
	}

	if (arm->cc != ARM_CC_AL && arm->cc != ARM_CC_INVALID)
		printf("\tCode condition: %u\n", arm->cc);

	if (arm->update_flags)
		printf("\tUpdate-flags: True\n");

	if (arm->writeback)
		printf("\tWrite-back: True\n");

	if (arm->cps_mode)
		printf("\tCPSI-mode: %u\n", arm->cps_mode);

	if (arm->cps_flag)
		printf("\tCPSI-flag: %u\n", arm->cps_flag);

	if (arm->vector_data)
		printf("\tVector-data: %u\n", arm->vector_data);

	if (arm->vector_size)
		printf("\tVector-size: %u\n", arm->vector_size);

	if (arm->usermode)
		printf("\tUser-mode: True\n");

	if (arm->mem_barrier)
		printf("\tMemory-barrier: %u\n", arm->mem_barrier);

	printf("\n");
}